

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O2

void readDFA(string *fileName,adjacencyType *adjVec,int *numOfStates,
            vector<edge,_std::allocator<edge>_> *newEdges)

{
  char delim;
  undefined1 local_260 [32];
  string curString;
  ifstream fileStream;
  
  anon_unknown.dwarf_28c33::openFile((anon_unknown_dwarf_28c33 *)&fileStream,fileName);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_260,"[0-9]+",0x10);
  anon_unknown.dwarf_28c33::skipUntilRegex(&curString,&fileStream,(regex *)local_260);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_260);
  anon_unknown.dwarf_28c33::split
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_260,&curString,delim);
  *numOfStates = (int)((ulong)(local_260._8_8_ - local_260._0_8_) >> 5);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_260);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&fileStream,(string *)&curString);
  anon_unknown.dwarf_28c33::readEdges(&fileStream,adjVec,*numOfStates,&curString,newEdges);
  std::__cxx11::string::~string((string *)&curString);
  std::ifstream::~ifstream(&fileStream);
  return;
}

Assistant:

void readDFA(const string & fileName,
             adjacencyType & adjVec,
             int & numOfStates,
             vector<edge> & newEdges)
{
    ifstream fileStream = openFile(fileName);

    // get number of states
    string curString = skipUntilRegex(fileStream, regex("[0-9]+"));
    numOfStates = static_cast<int>(split(curString, ';').size());
    getline(fileStream, curString);

    readEdges(fileStream, adjVec, static_cast<unsigned int>(numOfStates), curString, newEdges);
}